

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

void luaL_traceback(lua_State *L,lua_State *L1,char *msg,int level)

{
  TValue *pTVar1;
  TValue *pTVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  char *fmt;
  ulong uVar6;
  int local_b0;
  lua_Debug ar;
  
  pTVar1 = L->top;
  pTVar2 = L->base;
  if (msg != (char *)0x0) {
    lua_pushfstring(L,"%s\n");
  }
  lua_pushlstring(L,"stack traceback:",0x10);
  iVar5 = 0xc;
  do {
    while( true ) {
      iVar3 = lua_getstack(L1,level,&ar);
      local_b0 = (int)((ulong)((long)pTVar1 - (long)pTVar2) >> 3);
      if (iVar3 == 0) {
        lua_concat(L,(int)((ulong)((long)L->top - (long)L->base) >> 3) - local_b0);
        return;
      }
      if (level < iVar5) break;
      iVar3 = lua_getstack(L1,level + 0xb,&ar);
      iVar5 = 0x7fffffff;
      if (iVar3 != 0) {
        lua_pushlstring(L,"\n\t...",5);
        lua_getstack(L1,-10,&ar);
        level = ar.i_ci + -10;
      }
    }
    lua_getinfo(L1,"Snlf",&ar);
    uVar6 = (ulong)L1->top[-1].u32.lo;
    L1->top = L1->top + -1;
    if ((*(byte *)(uVar6 + 6) < 2) || (*ar.namewhat != '\0')) {
      lua_pushfstring(L,"\n\t%s:",ar.short_src);
    }
    else {
      lua_pushfstring(L,"\n\t[builtin#%d]:");
    }
    if (0 < ar.currentline) {
      lua_pushfstring(L,"%d:");
    }
    if (*ar.namewhat == '\0') {
      if (*ar.what == 'C') {
        pcVar4 = *(char **)(uVar6 + 0x18);
        fmt = " at %p";
        goto LAB_0010cbfb;
      }
      if (*ar.what == 'm') {
        lua_pushlstring(L," in main chunk",0xe);
      }
      else {
        lua_pushfstring(L," in function <%s:%d>",ar.short_src,(ulong)(uint)ar.linedefined);
      }
    }
    else {
      fmt = " in function \'%s\'";
      pcVar4 = ar.name;
LAB_0010cbfb:
      lua_pushfstring(L,fmt,pcVar4);
    }
    local_b0 = (int)((ulong)((long)L->top - (long)L->base) >> 3) - local_b0;
    if (0xe < local_b0) {
      lua_concat(L,local_b0);
    }
    level = level + 1;
  } while( true );
}

Assistant:

LUALIB_API void luaL_traceback (lua_State *L, lua_State *L1, const char *msg,
				int level)
{
  int top = (int)(L->top - L->base);
  int lim = TRACEBACK_LEVELS1;
  lua_Debug ar;
  if (msg) lua_pushfstring(L, "%s\n", msg);
  lua_pushliteral(L, "stack traceback:");
  while (lua_getstack(L1, level++, &ar)) {
    GCfunc *fn;
    if (level > lim) {
      if (!lua_getstack(L1, level + TRACEBACK_LEVELS2, &ar)) {
	level--;
      } else {
	lua_pushliteral(L, "\n\t...");
	lua_getstack(L1, -10, &ar);
	level = ar.i_ci - TRACEBACK_LEVELS2;
      }
      lim = 2147483647;
      continue;
    }
    lua_getinfo(L1, "Snlf", &ar);
    fn = funcV(L1->top-1); L1->top--;
    if (isffunc(fn) && !*ar.namewhat)
      lua_pushfstring(L, "\n\t[builtin#%d]:", fn->c.ffid);
    else
      lua_pushfstring(L, "\n\t%s:", ar.short_src);
    if (ar.currentline > 0)
      lua_pushfstring(L, "%d:", ar.currentline);
    if (*ar.namewhat) {
      lua_pushfstring(L, " in function " LUA_QS, ar.name);
    } else {
      if (*ar.what == 'm') {
	lua_pushliteral(L, " in main chunk");
      } else if (*ar.what == 'C') {
	lua_pushfstring(L, " at %p", fn->c.f);
      } else {
	lua_pushfstring(L, " in function <%s:%d>",
			ar.short_src, ar.linedefined);
      }
    }
    if ((int)(L->top - L->base) - top >= 15)
      lua_concat(L, (int)(L->top - L->base) - top);
  }
  lua_concat(L, (int)(L->top - L->base) - top);
}